

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

int ON_Font::CompareFontNamePointer(ON_wString *lhs,ON_wString *rhs)

{
  int iVar1;
  wchar_t *lhs_00;
  wchar_t *rhs_00;
  
  if (lhs == rhs) {
    iVar1 = 0;
  }
  else if (lhs == (ON_wString *)0x0) {
    iVar1 = 1;
  }
  else {
    if (rhs != (ON_wString *)0x0) {
      lhs_00 = ON_wString::operator_cast_to_wchar_t_(lhs);
      rhs_00 = ON_wString::operator_cast_to_wchar_t_(rhs);
      iVar1 = CompareFontNameWideChar(lhs_00,rhs_00);
      return iVar1;
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ON_Font::CompareFontNamePointer(const ON_wString* lhs, const ON_wString* rhs)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  return ON_Font::CompareFontName(*lhs, *rhs);
}